

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O2

boolean use_merged_upsample(j_decompress_ptr cinfo)

{
  J_COLOR_SPACE JVar1;
  int iVar2;
  jpeg_component_info *pjVar3;
  
  if ((((cinfo->do_fancy_upsampling == 0) && (cinfo->CCIR601_sampling == 0)) &&
      (cinfo->jpeg_color_space == JCS_YCbCr)) && (cinfo->num_components == 3)) {
    JVar1 = cinfo->out_color_space;
    if ((JVar1 - JCS_EXT_RGB < 10) || (JVar1 == JCS_RGB)) {
      if (cinfo->out_color_components != rgb_pixelsize[JVar1]) {
        return 0;
      }
    }
    else {
      if (JVar1 != JCS_RGB565) {
        return 0;
      }
      if (cinfo->out_color_components != 3) {
        return 0;
      }
    }
    pjVar3 = cinfo->comp_info;
    if (((pjVar3->h_samp_factor == 2) && (pjVar3[1].h_samp_factor == 1)) &&
       ((pjVar3[2].h_samp_factor == 1 &&
        ((((pjVar3->v_samp_factor < 3 && (pjVar3[1].v_samp_factor == 1)) &&
          (pjVar3[2].v_samp_factor == 1)) &&
         ((iVar2 = pjVar3->DCT_scaled_size, iVar2 == cinfo->min_DCT_scaled_size &&
          (pjVar3[1].DCT_scaled_size == iVar2)))))))) {
      return (boolean)(pjVar3[2].DCT_scaled_size == iVar2);
    }
  }
  return 0;
}

Assistant:

LOCAL(boolean)
use_merged_upsample(j_decompress_ptr cinfo)
{
#ifdef UPSAMPLE_MERGING_SUPPORTED
  /* Merging is the equivalent of plain box-filter upsampling */
  if (cinfo->do_fancy_upsampling || cinfo->CCIR601_sampling)
    return FALSE;
  /* jdmerge.c only supports YCC=>RGB and YCC=>RGB565 color conversion */
  if (cinfo->jpeg_color_space != JCS_YCbCr || cinfo->num_components != 3 ||
      (cinfo->out_color_space != JCS_RGB &&
       cinfo->out_color_space != JCS_RGB565 &&
       cinfo->out_color_space != JCS_EXT_RGB &&
       cinfo->out_color_space != JCS_EXT_RGBX &&
       cinfo->out_color_space != JCS_EXT_BGR &&
       cinfo->out_color_space != JCS_EXT_BGRX &&
       cinfo->out_color_space != JCS_EXT_XBGR &&
       cinfo->out_color_space != JCS_EXT_XRGB &&
       cinfo->out_color_space != JCS_EXT_RGBA &&
       cinfo->out_color_space != JCS_EXT_BGRA &&
       cinfo->out_color_space != JCS_EXT_ABGR &&
       cinfo->out_color_space != JCS_EXT_ARGB))
    return FALSE;
  if ((cinfo->out_color_space == JCS_RGB565 &&
       cinfo->out_color_components != 3) ||
      (cinfo->out_color_space != JCS_RGB565 &&
       cinfo->out_color_components != rgb_pixelsize[cinfo->out_color_space]))
    return FALSE;
  /* and it only handles 2h1v or 2h2v sampling ratios */
  if (cinfo->comp_info[0].h_samp_factor != 2 ||
      cinfo->comp_info[1].h_samp_factor != 1 ||
      cinfo->comp_info[2].h_samp_factor != 1 ||
      cinfo->comp_info[0].v_samp_factor >  2 ||
      cinfo->comp_info[1].v_samp_factor != 1 ||
      cinfo->comp_info[2].v_samp_factor != 1)
    return FALSE;
  /* furthermore, it doesn't work if we've scaled the IDCTs differently */
  if (cinfo->comp_info[0]._DCT_scaled_size != cinfo->_min_DCT_scaled_size ||
      cinfo->comp_info[1]._DCT_scaled_size != cinfo->_min_DCT_scaled_size ||
      cinfo->comp_info[2]._DCT_scaled_size != cinfo->_min_DCT_scaled_size)
    return FALSE;
  /* ??? also need to test for upsample-time rescaling, when & if supported */
  return TRUE;                  /* by golly, it'll work... */
#else
  return FALSE;
#endif
}